

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  
  internal::Mutex::Lock(&this->prototypes_mutex_);
  pMVar1 = GetPrototypeNoLock(this,type);
  internal::Mutex::Unlock(&this->prototypes_mutex_);
  return pMVar1;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}